

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_31::WebSocketImpl::receive(WebSocketImpl *this)

{
  _func_int *__src;
  _func_int *p_Var1;
  ulong uVar2;
  long lVar3;
  Disposer *pDVar4;
  byte bVar5;
  Array<unsigned_char> *__begin4;
  _func_int *p_Var6;
  TransformPromiseNodeBase *pTVar7;
  byte bVar8;
  ChainPromiseNode *pCVar9;
  ChainPromiseNode *extraout_RDX;
  ChainPromiseNode *extraout_RDX_00;
  ChainPromiseNode *extraout_RDX_01;
  ChainPromiseNode *extraout_RDX_02;
  ChainPromiseNode *extraout_RDX_03;
  ChainPromiseNode *extraout_RDX_04;
  Array<unsigned_char> *fragment_1;
  long lVar10;
  PromiseNode *pPVar11;
  _func_int **in_RSI;
  PromiseNode *pPVar12;
  ArrayDisposer *pAVar13;
  PromiseNode *pPVar14;
  _func_int **pp_Var15;
  Own<kj::_::ChainPromiseNode> OVar16;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> PVar17;
  Array<unsigned_char> message;
  Fault f;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2197:17),_unsigned_long>
  promise;
  Vector<kj::Array<unsigned_char>_> *__range4;
  byte local_da;
  Own<kj::_::PromiseNode> local_d8;
  ArrayDisposer *local_c8;
  Own<kj::_::PromiseNode> local_b8;
  Array<unsigned_char> local_a8;
  PromiseNode *pPStack_90;
  undefined4 local_88;
  undefined4 uStack_84;
  ArrayDisposer *local_80;
  PromiseNode *pPStack_78;
  ArrayDisposer *pAStack_70;
  Own<kj::_::PromiseNode> local_60;
  Own<kj::_::PromiseNode> local_50;
  WebSocketImpl *local_40;
  ArrayBuilder<kj::Array<unsigned_char>_> *local_38;
  
  __src = in_RSI[0x1a];
  p_Var1 = in_RSI[0x1b];
  p_Var6 = (_func_int *)0x2;
  if ((_func_int *)0x1 < p_Var1) {
    lVar10 = (ulong)((byte)__src[1] >> 7) * 4;
    p_Var6 = (_func_int *)(lVar10 + 2);
    bVar8 = (byte)__src[1] & 0x7f;
    if (bVar8 == 0x7e) {
      p_Var6 = (_func_int *)(lVar10 + 4);
    }
    else if (bVar8 == 0x7f) {
      p_Var6 = (_func_int *)((ulong)p_Var6 | 8);
    }
  }
  if (p_Var1 < p_Var6) {
    if (__src != in_RSI[0x17]) {
      if (p_Var1 != (_func_int *)0x0) {
        memmove(in_RSI[0x17],__src,(size_t)p_Var1);
      }
      in_RSI[0x1a] = in_RSI[0x17];
    }
    (**(code **)(*(long *)in_RSI[2] + 8))
              (&local_b8,in_RSI[2],in_RSI[0x1a] + (long)in_RSI[0x1b],1,
               (long)(in_RSI[0x17] + (long)in_RSI[0x18]) - (long)(in_RSI[0x1a] + (long)in_RSI[0x1b])
              );
    pTVar7 = (TransformPromiseNodeBase *)operator_new(0x30);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar7,&local_b8,
               _::
               TransformPromiseNode<kj::Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2069:17),_kj::_::PropagateException>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    (pTVar7->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045f8d8;
    pTVar7[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
    local_d8.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>,unsigned_long,kj::(anonymous_namespace)::WebSocketImpl::receive()::{lambda(unsigned_long)#1},kj::_::PropagateException>>
          ::instance;
    local_d8.ptr = (PromiseNode *)pTVar7;
    OVar16 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_a8,&local_d8);
    pPVar14 = local_d8.ptr;
    pCVar9 = OVar16.ptr;
    *(undefined4 *)&(this->super_WebSocket)._vptr_WebSocket = local_a8.ptr._0_4_;
    *(undefined4 *)((long)&(this->super_WebSocket)._vptr_WebSocket + 4) = local_a8.ptr._4_4_;
    *(undefined4 *)&(this->stream).disposer = (undefined4)local_a8.size_;
    *(undefined4 *)((long)&(this->stream).disposer + 4) = local_a8.size_._4_4_;
    if ((TransformPromiseNodeBase *)local_d8.ptr != (TransformPromiseNodeBase *)0x0) {
      local_d8.ptr = (PromiseNode *)0x0;
      (**(local_d8.disposer)->_vptr_Disposer)
                (local_d8.disposer,
                 ((PromiseNode *)&pPVar14->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar14->_vptr_PromiseNode)->_vptr_PromiseNode);
      pCVar9 = extraout_RDX;
    }
    pPVar14 = local_b8.ptr;
    if (local_b8.ptr != (PromiseNode *)0x0) {
      local_b8.ptr = (PromiseNode *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(local_b8.disposer._4_4_,local_b8.disposer._0_4_))
                ((undefined8 *)CONCAT44(local_b8.disposer._4_4_,local_b8.disposer._0_4_),
                 pPVar14->_vptr_PromiseNode[-2] + (long)&pPVar14->_vptr_PromiseNode);
      pCVar9 = extraout_RDX_00;
    }
    goto LAB_002cd94b;
  }
  in_RSI[0x1a] = __src + (long)p_Var6;
  in_RSI[0x1b] = p_Var1 + -(long)p_Var6;
  pPVar14 = (PromiseNode *)(ulong)((byte)__src[1] & 0x7f);
  if (pPVar14 == (PromiseNode *)0x7e) {
    pPVar14 = (PromiseNode *)
              (ulong)(ushort)(*(ushort *)(__src + 2) << 8 | *(ushort *)(__src + 2) >> 8);
  }
  else if (((byte)__src[1] & 0x7f) == 0x7f) {
    uVar2 = *(ulong *)(__src + 2);
    pPVar14 = (PromiseNode *)
              (uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
               | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
               (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38);
  }
  bVar8 = (byte)*__src;
  bVar5 = bVar8 & 0xf;
  if (bVar5 == 0) {
    if (in_RSI[0x14] == in_RSI[0x13]) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
                ((Fault *)&local_a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x82e,FAILED,"!fragments.empty()","\"unexpected continuation frame in WebSocket\""
                 ,(char (*) [43])"unexpected continuation frame in WebSocket");
      _::Debug::Fault::fatal((Fault *)&local_a8);
    }
    local_da = *(byte *)(in_RSI + 0x12);
  }
  else {
    local_da = bVar5;
    if ((bVar5 < 8) && (in_RSI[0x14] != in_RSI[0x13])) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
                ((Fault *)&local_a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x832,FAILED,"fragments.empty()","\"expected continuation frame in WebSocket\"",
                 (char (*) [41])0x3ba69d);
      _::Debug::Fault::fatal((Fault *)&local_a8);
    }
  }
  local_d8.disposer = (Disposer *)0x0;
  local_d8.ptr = (PromiseNode *)0x0;
  local_c8 = (ArrayDisposer *)0x0;
  if ((char)bVar8 < '\0') {
    pPVar12 = (PromiseNode *)((long)&pPVar14->_vptr_PromiseNode + (ulong)(local_da == 1));
    if (bVar5 < 8) {
      p_Var6 = in_RSI[0x13];
      if (in_RSI[0x14] != p_Var6) {
        local_38 = (ArrayBuilder<kj::Array<unsigned_char>_> *)(in_RSI + 0x13);
        lVar10 = 0;
        do {
          lVar10 = lVar10 + *(long *)(p_Var6 + 8);
          p_Var6 = p_Var6 + 0x18;
        } while (p_Var6 != in_RSI[0x14]);
        pPVar11 = (PromiseNode *)((long)&pPVar12->_vptr_PromiseNode + lVar10);
        local_a8.ptr = (uchar *)_::HeapArrayDisposer::allocateImpl
                                          (1,(size_t)pPVar11,(size_t)pPVar11,
                                           (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
        pPVar12 = local_d8.ptr;
        pDVar4 = local_d8.disposer;
        local_a8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
        local_a8.size_ = (size_t)pPVar11;
        local_40 = this;
        if (local_d8.disposer != (Disposer *)0x0) {
          local_d8.disposer = (Disposer *)0x0;
          local_d8.ptr = (PromiseNode *)0x0;
          (*(code *)*local_c8->_vptr_ArrayDisposer)(local_c8,pDVar4,1,pPVar12,pPVar12,0);
        }
        local_d8.disposer = (Disposer *)local_a8.ptr;
        local_d8.ptr = (PromiseNode *)local_a8.size_;
        local_c8 = local_a8.disposer;
        p_Var1 = in_RSI[0x14];
        lVar10 = 0;
        for (p_Var6 = in_RSI[0x13]; p_Var6 != p_Var1; p_Var6 = p_Var6 + 0x18) {
          memcpy((void *)((long)local_d8.disposer + 0x50 + lVar10 + -0x50),*(void **)p_Var6,
                 *(size_t *)(p_Var6 + 8));
          lVar10 = lVar10 + *(long *)(p_Var6 + 8);
        }
        lVar3 = (long)local_d8.disposer + 0x50;
        ArrayBuilder<kj::Array<unsigned_char>_>::clear(local_38);
        *(undefined4 *)(in_RSI + 0x12) = 0;
        this = local_40;
        pAVar13 = (ArrayDisposer *)(lVar3 + lVar10 + -0x50);
        goto LAB_002cd6a9;
      }
    }
    local_a8.ptr = (uchar *)_::HeapArrayDisposer::allocateImpl
                                      (1,(size_t)pPVar12,(size_t)pPVar12,(_func_void_void_ptr *)0x0,
                                       (_func_void_void_ptr *)0x0);
    pPVar11 = local_d8.ptr;
    pDVar4 = local_d8.disposer;
    local_a8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    local_a8.size_ = (size_t)pPVar12;
    if (local_d8.disposer != (Disposer *)0x0) {
      local_d8.disposer = (Disposer *)0x0;
      local_d8.ptr = (PromiseNode *)0x0;
      (*(code *)*local_c8->_vptr_ArrayDisposer)(local_c8,pDVar4,1,pPVar11,pPVar11,0);
    }
    local_d8.disposer = (Disposer *)local_a8.ptr;
    local_d8.ptr = (PromiseNode *)local_a8.size_;
    local_c8 = local_a8.disposer;
    pAVar13 = (ArrayDisposer *)local_a8.ptr;
  }
  else {
    if (7 < bVar5) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                ((Fault *)&local_a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x853,FAILED,"isData","\"WebSocket control frame cannot be fragmented\"",
                 (char (*) [45])"WebSocket control frame cannot be fragmented");
      _::Debug::Fault::fatal((Fault *)&local_a8);
    }
    local_a8.ptr = (uchar *)_::HeapArrayDisposer::allocateImpl
                                      (1,(size_t)pPVar14,(size_t)pPVar14,(_func_void_void_ptr *)0x0,
                                       (_func_void_void_ptr *)0x0);
    pPVar12 = local_d8.ptr;
    pDVar4 = local_d8.disposer;
    local_a8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    local_a8.size_ = (size_t)pPVar14;
    if (local_d8.disposer != (Disposer *)0x0) {
      local_d8.disposer = (Disposer *)0x0;
      local_d8.ptr = (PromiseNode *)0x0;
      (*(code *)*local_c8->_vptr_ArrayDisposer)(local_c8,pDVar4,1,pPVar12,pPVar12,0);
    }
    local_d8.disposer = (Disposer *)local_a8.ptr;
    local_d8.ptr = (PromiseNode *)local_a8.size_;
    local_c8 = local_a8.disposer;
    pAVar13 = (ArrayDisposer *)local_a8.ptr;
    if (in_RSI[0x14] == in_RSI[0x13]) {
      *(uint *)(in_RSI + 0x12) = (uint)local_da;
    }
  }
LAB_002cd6a9:
  local_88 = 0;
  if ((char)__src[1] < '\0') {
    bVar5 = (byte)__src[1] & 0x7f;
    lVar10 = 10;
    if (bVar5 != 0x7f) {
      lVar10 = (ulong)(bVar5 == 0x7e) * 2 + 2;
    }
    local_88 = *(undefined4 *)(__src + lVar10);
  }
  local_a8.size_ = CONCAT71(local_a8.size_._1_7_,local_da);
  uStack_84 = CONCAT31(uStack_84._1_3_,bVar8 >> 7);
  local_80 = (ArrayDisposer *)local_d8.disposer;
  pPStack_78 = local_d8.ptr;
  pAStack_70 = local_c8;
  local_d8.disposer = (Disposer *)0x0;
  local_d8.ptr = (PromiseNode *)0x0;
  local_a8.disposer = pAVar13;
  pPStack_90 = pPVar14;
  if ((PromiseNode *)in_RSI[0x1b] < pPVar14) {
    local_a8.ptr = (uchar *)in_RSI;
    memcpy(pAVar13,in_RSI[0x1a],(size_t)in_RSI[0x1b]);
    pp_Var15 = (_func_int **)((long)pPVar14 - (long)in_RSI[0x1b]);
    (**(code **)(*(long *)in_RSI[2] + 8))
              (&local_b8,in_RSI[2],in_RSI[0x1b] + (long)pAVar13 + 0x50 + -0x50,pp_Var15,pp_Var15);
    pTVar7 = (TransformPromiseNodeBase *)operator_new(0x30);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar7,&local_b8,
               _::
               TransformPromiseNode<kj::_::Void,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2197:17),_kj::_::PropagateException>
               ::anon_class_8_1_49713496_for_func::operator());
    pPVar14 = local_b8.ptr;
    (pTVar7->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045f960;
    pTVar7[1].super_PromiseNode._vptr_PromiseNode = pp_Var15;
    local_60.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,unsigned_long,kj::(anonymous_namespace)::WebSocketImpl::receive()::{lambda(unsigned_long)#2},kj::_::PropagateException>>
          ::instance;
    local_60.ptr = (PromiseNode *)pTVar7;
    if (local_b8.ptr != (PromiseNode *)0x0) {
      local_b8.ptr = (PromiseNode *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(local_b8.disposer._4_4_,local_b8.disposer._0_4_))
                ((undefined8 *)CONCAT44(local_b8.disposer._4_4_,local_b8.disposer._0_4_),
                 pPVar14->_vptr_PromiseNode[-2] + (long)&pPVar14->_vptr_PromiseNode);
    }
    in_RSI[0x1a] = (_func_int *)0x0;
    in_RSI[0x1b] = (_func_int *)0x0;
    pTVar7 = (TransformPromiseNodeBase *)operator_new(0x68);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar7,&local_60,
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2144:9),_kj::Array<unsigned_char>_>
               ::operator()<>);
    (pTVar7->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045f9e8;
    pTVar7[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_a8.ptr;
    pTVar7[1].dependency.disposer = (Disposer *)local_a8.size_;
    pTVar7[1].dependency.ptr = (PromiseNode *)local_a8.disposer;
    pTVar7[1].continuationTracePtr = pPStack_90;
    pTVar7[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)CONCAT44(uStack_84,local_88);
    pTVar7[2].dependency.disposer = (Disposer *)local_80;
    pTVar7[2].dependency.ptr = pPStack_78;
    pTVar7[2].continuationTracePtr = pAStack_70;
    local_80 = (ArrayDisposer *)0x0;
    pPStack_78 = (PromiseNode *)0x0;
    local_50.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>,kj::_::Void,kj::CaptureByMove<kj::(anonymous_namespace)::WebSocketImpl::receive()::{lambda(kj::Array<unsigned_char>&&)#1},kj::Array<unsigned_char>>,kj::_::PropagateException>>
          ::instance;
    local_50.ptr = (PromiseNode *)pTVar7;
    OVar16 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_b8,&local_50);
    pPVar14 = local_50.ptr;
    pCVar9 = OVar16.ptr;
    *(undefined4 *)&(this->super_WebSocket)._vptr_WebSocket = local_b8.disposer._0_4_;
    *(undefined4 *)((long)&(this->super_WebSocket)._vptr_WebSocket + 4) = local_b8.disposer._4_4_;
    *(undefined4 *)&(this->stream).disposer = local_b8.ptr._0_4_;
    *(undefined4 *)((long)&(this->stream).disposer + 4) = local_b8.ptr._4_4_;
    if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
      local_50.ptr = (PromiseNode *)0x0;
      (**(local_50.disposer)->_vptr_Disposer)
                (local_50.disposer,
                 ((PromiseNode *)&pPVar14->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar14->_vptr_PromiseNode)->_vptr_PromiseNode);
      pCVar9 = extraout_RDX_01;
    }
    pPVar14 = local_60.ptr;
    if ((TransformPromiseNodeBase *)local_60.ptr != (TransformPromiseNodeBase *)0x0) {
      local_60.ptr = (PromiseNode *)0x0;
      (**(local_60.disposer)->_vptr_Disposer)
                (local_60.disposer,
                 ((PromiseNode *)&pPVar14->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar14->_vptr_PromiseNode)->_vptr_PromiseNode);
      pCVar9 = extraout_RDX_02;
    }
  }
  else {
    memcpy(pAVar13,in_RSI[0x1a],(size_t)pPVar14);
    in_RSI[0x1a] = (_func_int *)((long)&pPVar14->_vptr_PromiseNode + (long)in_RSI[0x1a]);
    in_RSI[0x1b] = in_RSI[0x1b] + -(long)pPVar14;
    PVar17 = CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2144:9),_kj::Array<unsigned_char>_>
             ::anon_class_40_6_f6836660_for_func::operator()
                       ((anon_class_40_6_f6836660_for_func *)this,&local_a8);
    pCVar9 = PVar17.super_PromiseBase.node.ptr;
  }
  pPVar14 = pPStack_78;
  pAVar13 = local_80;
  if (local_80 != (ArrayDisposer *)0x0) {
    local_80 = (ArrayDisposer *)0x0;
    pPStack_78 = (PromiseNode *)0x0;
    (**pAStack_70->_vptr_ArrayDisposer)(pAStack_70,pAVar13,1,pPVar14,pPVar14,0);
    pCVar9 = extraout_RDX_03;
  }
  pPVar14 = local_d8.ptr;
  pDVar4 = local_d8.disposer;
  if (local_d8.disposer != (Disposer *)0x0) {
    local_d8.disposer = (Disposer *)0x0;
    local_d8.ptr = (PromiseNode *)0x0;
    (**local_c8->_vptr_ArrayDisposer)(local_c8,pDVar4,1,pPVar14,pPVar14,0);
    pCVar9 = extraout_RDX_04;
  }
LAB_002cd94b:
  PVar17.super_PromiseBase.node.ptr = &pCVar9->super_PromiseNode;
  PVar17.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
         PVar17.super_PromiseBase.node;
}

Assistant:

kj::Promise<Message> receive() override {
    size_t headerSize = Header::headerSize(recvData.begin(), recvData.size());

    if (headerSize > recvData.size()) {
      if (recvData.begin() != recvBuffer.begin()) {
        // Move existing data to front of buffer.
        if (recvData.size() > 0) {
          memmove(recvBuffer.begin(), recvData.begin(), recvData.size());
        }
        recvData = recvBuffer.slice(0, recvData.size());
      }

      return stream->tryRead(recvData.end(), 1, recvBuffer.end() - recvData.end())
          .then([this](size_t actual) -> kj::Promise<Message> {
        if (actual == 0) {
          if (recvData.size() > 0) {
            return KJ_EXCEPTION(DISCONNECTED, "WebSocket EOF in frame header");
          } else {
            // It's incorrect for the WebSocket to disconnect without sending `Close`.
            return KJ_EXCEPTION(DISCONNECTED,
                "WebSocket disconnected between frames without sending `Close`.");
          }
        }

        recvData = recvBuffer.slice(0, recvData.size() + actual);
        return receive();
      });
    }

    auto& recvHeader = *reinterpret_cast<Header*>(recvData.begin());

    recvData = recvData.slice(headerSize, recvData.size());

    size_t payloadLen = recvHeader.getPayloadLen();

    auto opcode = recvHeader.getOpcode();
    bool isData = opcode < OPCODE_FIRST_CONTROL;
    if (opcode == OPCODE_CONTINUATION) {
      KJ_REQUIRE(!fragments.empty(), "unexpected continuation frame in WebSocket");

      opcode = fragmentOpcode;
    } else if (isData) {
      KJ_REQUIRE(fragments.empty(), "expected continuation frame in WebSocket");
    }

    bool isFin = recvHeader.isFin();

    kj::Array<byte> message;           // space to allocate
    byte* payloadTarget;               // location into which to read payload (size is payloadLen)
    if (isFin) {
      // Add space for NUL terminator when allocating text message.
      size_t amountToAllocate = payloadLen + (opcode == OPCODE_TEXT && isFin);

      if (isData && !fragments.empty()) {
        // Final frame of a fragmented message. Gather the fragments.
        size_t offset = 0;
        for (auto& fragment: fragments) offset += fragment.size();
        message = kj::heapArray<byte>(offset + amountToAllocate);

        offset = 0;
        for (auto& fragment: fragments) {
          memcpy(message.begin() + offset, fragment.begin(), fragment.size());
          offset += fragment.size();
        }
        payloadTarget = message.begin() + offset;

        fragments.clear();
        fragmentOpcode = 0;
      } else {
        // Single-frame message.
        message = kj::heapArray<byte>(amountToAllocate);
        payloadTarget = message.begin();
      }
    } else {
      // Fragmented message, and this isn't the final fragment.
      KJ_REQUIRE(isData, "WebSocket control frame cannot be fragmented");

      message = kj::heapArray<byte>(payloadLen);
      payloadTarget = message.begin();
      if (fragments.empty()) {
        // This is the first fragment, so set the opcode.
        fragmentOpcode = opcode;
      }
    }

    Mask mask = recvHeader.getMask();

    auto handleMessage = kj::mvCapture(message,
        [this,opcode,payloadTarget,payloadLen,mask,isFin]
        (kj::Array<byte>&& message) -> kj::Promise<Message> {
      if (!mask.isZero()) {
        mask.apply(kj::arrayPtr(payloadTarget, payloadLen));
      }

      if (!isFin) {
        // Add fragment to the list and loop.
        fragments.add(kj::mv(message));
        return receive();
      }

      switch (opcode) {
        case OPCODE_CONTINUATION:
          // Shouldn't get here; handled above.
          KJ_UNREACHABLE;
        case OPCODE_TEXT:
          message.back() = '\0';
          return Message(kj::String(message.releaseAsChars()));
        case OPCODE_BINARY:
          return Message(message.releaseAsBytes());
        case OPCODE_CLOSE:
          if (message.size() < 2) {
            return Message(Close { 1005, nullptr });
          } else {
            uint16_t status = (static_cast<uint16_t>(message[0]) << 8)
                            | (static_cast<uint16_t>(message[1])     );
            return Message(Close {
              status, kj::heapString(message.slice(2, message.size()).asChars())
            });
          }
        case OPCODE_PING:
          // Send back a pong.
          queuePong(kj::mv(message));
          return receive();
        case OPCODE_PONG:
          // Unsolicited pong. Ignore.
          return receive();
        default:
          KJ_FAIL_REQUIRE("unknown WebSocket opcode", opcode);
      }
    });

    if (payloadLen <= recvData.size()) {
      // All data already received.
      memcpy(payloadTarget, recvData.begin(), payloadLen);
      recvData = recvData.slice(payloadLen, recvData.size());
      return handleMessage();
    } else {
      // Need to read more data.
      memcpy(payloadTarget, recvData.begin(), recvData.size());
      size_t remaining = payloadLen - recvData.size();
      auto promise = stream->tryRead(payloadTarget + recvData.size(), remaining, remaining)
          .then([remaining](size_t amount) {
        if (amount < remaining) {
          kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "WebSocket EOF in message"));
        }
      });
      recvData = nullptr;
      return promise.then(kj::mv(handleMessage));
    }
  }